

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_parser.hpp
# Opt level: O0

void __thiscall
example::push_parser<printing_callbacks>::parse(push_parser<printing_callbacks> *this)

{
  bool bVar1;
  value vVar2;
  long value;
  double value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  push_parser<printing_callbacks> *local_10;
  push_parser<printing_callbacks> *this_local;
  
  local_10 = this;
  do {
    vVar2 = trial::protocol::json::basic_reader<char>::symbol(&this->reader);
    switch(vVar2) {
    case null:
      printing_callbacks::on_null((printing_callbacks *)&this->field_0x148);
      break;
    case boolean:
      bVar1 = trial::protocol::json::basic_reader<char>::value<bool>(&this->reader);
      printing_callbacks::on_boolean((printing_callbacks *)&this->field_0x148,bVar1);
      break;
    case integer:
      value = trial::protocol::json::basic_reader<char>::value<long>(&this->reader);
      printing_callbacks::on_integer((printing_callbacks *)&this->field_0x148,value);
      break;
    case real:
      value_00 = trial::protocol::json::basic_reader<char>::value<double>(&this->reader);
      printing_callbacks::on_real((printing_callbacks *)&this->field_0x148,value_00);
      break;
    case string:
    case key:
      trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
                (&local_30,&this->reader);
      printing_callbacks::on_string((printing_callbacks *)&this->field_0x148,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      break;
    case begin_array:
      printing_callbacks::on_begin_array((printing_callbacks *)&this->field_0x148);
      break;
    case end_array:
      printing_callbacks::on_end_array((printing_callbacks *)&this->field_0x148);
      break;
    case begin_object:
      printing_callbacks::on_begin_object((printing_callbacks *)&this->field_0x148);
      break;
    case end_object:
      printing_callbacks::on_end_object((printing_callbacks *)&this->field_0x148);
    }
    bVar1 = trial::protocol::json::basic_reader<char>::next(&this->reader);
  } while (bVar1);
  return;
}

Assistant:

void parse()
    {
        do
        {
            switch (reader.symbol())
            {
            case json::token::symbol::null:
                callbacks.on_null();
                break;

            case json::token::symbol::boolean:
                callbacks.on_boolean(reader.value<bool>());
                break;

            case json::token::symbol::integer:
                callbacks.on_integer(reader.value<std::intmax_t>());
                break;

            case json::token::symbol::real:
                callbacks.on_real(reader.value<double>());
                break;

            case json::token::symbol::key:
            case json::token::symbol::string:
                callbacks.on_string(reader.value<std::string>());
                break;

            case json::token::symbol::begin_array:
                callbacks.on_begin_array();
                break;

            case json::token::symbol::end_array:
                callbacks.on_end_array();
                break;

            case json::token::symbol::begin_object:
                callbacks.on_begin_object();
                break;

            case json::token::symbol::end_object:
                callbacks.on_end_object();
                break;

            default:
                break;
            }

        } while (reader.next());
    }